

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsvctrl.c
# Opt level: O0

int main(int argc,char **argv)

{
  int __fd;
  int iVar1;
  char **ppcVar2;
  uint *p2;
  int p1;
  bool bVar3;
  char local_25;
  char c;
  char **ppcStack_20;
  int curdir;
  char **dir;
  char **argv_local;
  int argc_local;
  
  ppcVar2 = argv + 1;
  progname = *argv;
  if ((ppcVar2 == (char **)0x0) || (*ppcVar2 == (char *)0x0)) {
    usage();
  }
  local_25 = **ppcVar2;
  p2 = &switchD_00102404::switchdataD_00104004;
  switch(local_25 + -0x31) {
  default:
    usage();
    break;
  case 0x34:
    local_25 = 'x';
  case 0:
  case 1:
  case 0x30:
  case 0x32:
  case 0x33:
  case 0x37:
  case 0x38:
  case 0x3a:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x43:
  case 0x44:
  case 0x47:
  }
  ppcStack_20 = argv + 2;
  if ((ppcStack_20 == (char **)0x0) || (*ppcStack_20 == (char *)0x0)) {
    usage();
  }
  __fd = open_read(".");
  if (__fd == -1) {
    rc = 100;
    fatal("unable to open current directory");
  }
  while( true ) {
    bVar3 = false;
    if (ppcStack_20 != (char **)0x0) {
      bVar3 = *ppcStack_20 != (char *)0x0;
    }
    if (!bVar3) break;
    iVar1 = chdir(*ppcStack_20);
    if (iVar1 == -1) {
      warn(*ppcStack_20,"unable to change directory");
    }
    else {
      ctrl((EVP_PKEY_CTX *)*ppcStack_20,(int)local_25,p1,p2);
      iVar1 = fchdir(__fd);
      if (iVar1 == -1) {
        rc = 100;
        fatal("unable to change directory");
      }
    }
    ppcStack_20 = ppcStack_20 + 1;
  }
  if (100 < rc) {
    rc = 100;
  }
  _exit(rc);
}

Assistant:

int main(int argc, char **argv) {
  char **dir;
  int curdir;
  char c;

  progname =*argv++;

  if (! argv || ! *argv) usage();

  switch ((c =**argv)) {
  case 'e': c ='x';
  case 'u': case 'd': case 'o': case 'x': case 'p': case 'c': case 'h':
  case 'a': case 'i': case 't': case 'k': case 'q': case '1': case '2':
    break;
  default:
    usage();
  }
  dir =++argv;
  if (! dir || ! *dir) usage();

  if ((curdir =open_read(".")) == -1) {
    rc =100;
    fatal("unable to open current directory");
  }
  for (; dir && *dir; dir++) {
    if (chdir(*dir) == -1) {
      warn(*dir, "unable to change directory");
      continue;
    }
    ctrl(*dir, c);
    if (fchdir(curdir) == -1) {
      rc =100;
      fatal("unable to change directory");
    }
  }
  if (rc > 100) rc =100;
  _exit(rc);
}